

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::ReAlloc(DMatrix *this,size_t length,bool label)

{
  byte in_DL;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  value_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff30;
  DMatrix *in_stack_ffffffffffffff50;
  
  Reset(in_stack_ffffffffffffff50);
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = in_ESI;
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::resize((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (value_type_conflict *)in_stack_ffffffffffffff20);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (value_type_conflict *)in_stack_ffffffffffffff20);
  *(byte *)(in_RDI + 0xc) = in_DL & 1;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  return;
}

Assistant:

void ReAlloc(size_t length, bool label = true) {
    CHECK_GE(length, 0);
    this->Reset();
    this->hash_value_1 = 0;
    this->hash_value_2 = 0;
    this->row_length = length;
    this->row.resize(length, nullptr);
    this->Y.resize(length, 0);
    // Here we set norm to 1.0 by default, which means
    // that we don't use instance-wise normalization
    this->norm.resize(length, 1.0);
    // Indicate that if current dataset has the label y
    this->has_label = label;
    this->pos = 0;
  }